

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O1

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,long n)

{
  byte bVar1;
  StringBuffer *pSVar2;
  byte *__n;
  ulong in_RDX;
  void *__buf;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  char fbuf [64];
  byte local_48;
  byte local_47 [71];
  
  __n = &local_48;
  if (n < 0) {
    __n = local_47;
    local_48 = 0x2d;
    n = -n;
  }
  pbVar3 = __n;
  if (n != 0) {
    do {
      in_RDX = (ulong)n / 10;
      *pbVar3 = (char)n + (char)in_RDX * -10 | 0x30;
      pbVar3 = pbVar3 + 1;
      bVar5 = 9 < (ulong)n;
      n = in_RDX;
    } while (bVar5);
  }
  if (__n == pbVar3) {
    *pbVar3 = 0x30;
    pbVar3 = pbVar3 + 1;
  }
  *pbVar3 = 0;
  pbVar4 = pbVar3 + -1;
  __buf = (void *)CONCAT71((int7)(in_RDX >> 8),__n < pbVar4 && __n != pbVar3);
  if (__n < pbVar4 && __n != pbVar3) {
    pbVar3 = __n + 1;
    do {
      bVar1 = pbVar3[-1];
      __buf = (void *)CONCAT71((int7)((ulong)__buf >> 8),*pbVar4);
      pbVar3[-1] = *pbVar4;
      *pbVar4 = bVar1;
      pbVar4 = pbVar4 + -1;
      __n = pbVar3 + 1;
      bVar5 = pbVar3 < pbVar4;
      pbVar3 = __n;
    } while (bVar5);
  }
  pSVar2 = (StringBuffer *)write(this,(int)&local_48,__buf,(size_t)__n);
  return pSVar2;
}

Assistant:

StringBuffer& operator<<(long int n)           { _ITOA(n); }